

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_opaque(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_context_t in_RSI;
  exr_context_t in_RDI;
  void *pdata;
  int32_t sz;
  exr_result_t rv;
  uint uVar2;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar2 = 0;
  eVar1 = exr_attr_opaquedata_pack
                    ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (exr_attr_opaquedata_t *)in_RDI,(int32_t *)in_RSI,
                     (void **)((ulong)in_stack_ffffffffffffffe4 << 0x20));
  if (((eVar1 == 0) && (eVar1 = save_attr_sz(in_RSI,(ulong)uVar2), eVar1 == 0)) && (0 < (int)uVar2))
  {
    eVar1 = (*in_RDI->do_write)(in_RDI,(void *)0x0,uVar2);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_opaque (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    int32_t      sz    = 0;
    void*        pdata = NULL;

    rv =
        exr_attr_opaquedata_pack ((exr_context_t) ctxt, a->opaque, &sz, &pdata);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = save_attr_sz (ctxt, (uint64_t) sz);
    if (rv == EXR_ERR_SUCCESS && sz > 0)
        rv = ctxt->do_write (
            ctxt, pdata, (uint64_t) sz, &(ctxt->output_file_offset));
    return rv;
}